

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

double ImGui::RoundScalarWithFormatT<double,double>(char *format,ImGuiDataType data_type,double v)

{
  char cVar1;
  char *pcVar2;
  char cStack_49;
  char v_str [64];
  
  pcVar2 = ImParseFormatFindStart(format);
  if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
    ImFormatString(v_str,0x40,pcVar2,v);
    pcVar2 = &cStack_49;
    do {
      cVar1 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while (cVar1 == ' ');
    if ((data_type & 0xfffffffeU) == 4) {
      v = atof(pcVar2);
    }
    else {
      v = 0.0;
      for (pcVar2 = pcVar2 + (ulong)(pcVar2[cVar1 == '-'] == '+') + (ulong)(cVar1 == '-');
          (byte)(*pcVar2 - 0x30U) < 10; pcVar2 = pcVar2 + 1) {
        v = v * 10.0 + (double)(int)(char)(*pcVar2 - 0x30U);
      }
      if (cVar1 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}